

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O0

RowVector __thiscall
rek::Solver::solve(Solver *this,SparseMatrix<double,_1,_int> *A,Matrix<double,__1,_1,_0,__1,_1> *b,
                  long maxIterations,double tolerance)

{
  Scalar SVar1;
  bool bVar2;
  Index IVar3;
  Index IVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Index extraout_RDX;
  RowVector RVar7;
  undefined1 local_c0 [8];
  InnerIterator it;
  long k;
  undefined1 local_80 [8];
  SparseMatrix<double,_0,_int> AColMajor;
  double tolerance_local;
  long maxIterations_local;
  Matrix<double,__1,_1,_0,__1,_1> *b_local;
  SparseMatrix<double,_1,_int> *A_local;
  Solver *this_local;
  
  AColMajor.m_data.m_allocatedSize = (Index)tolerance;
  IVar3 = Eigen::SparseMatrix<double,_1,_int>::rows((SparseMatrix<double,_1,_int> *)b);
  IVar4 = Eigen::SparseMatrix<double,_1,_int>::cols((SparseMatrix<double,_1,_int> *)b);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)local_80,IVar3,IVar4);
  IVar3 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::nonZeros
                    ((SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_> *)b);
  Eigen::SparseMatrix<double,_0,_int>::reserve((SparseMatrix<double,_0,_int> *)local_80,IVar3);
  it.m_end = 0;
  while( true ) {
    IVar3 = it.m_end;
    IVar4 = Eigen::SparseMatrix<double,_1,_int>::outerSize((SparseMatrix<double,_1,_int> *)b);
    if (IVar4 <= IVar3) break;
    Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::InnerIterator
              ((InnerIterator *)local_c0,
               (SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_> *)b,it.m_end);
    while( true ) {
      bVar2 = Eigen::SparseCompressedBase::InnerIterator::operator_cast_to_bool
                        ((InnerIterator *)local_c0);
      if (!bVar2) break;
      pSVar5 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::
               value((InnerIterator *)local_c0);
      SVar1 = *pSVar5;
      IVar3 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::row
                        ((InnerIterator *)local_c0);
      IVar4 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::col
                        ((InnerIterator *)local_c0);
      pSVar6 = Eigen::SparseMatrix<double,_0,_int>::insert
                         ((SparseMatrix<double,_0,_int> *)local_80,IVar3,IVar4);
      *pSVar6 = SVar1;
      Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::operator++
                ((InnerIterator *)local_c0);
    }
    it.m_end = it.m_end + 1;
  }
  solve(this,A,(SparseMatrix<double,_0,_int> *)b,(RowVector *)local_80,maxIterations,
        (double)AColMajor.m_data.m_allocatedSize);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)local_80);
  RVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  RVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (RowVector)RVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

RowVector solve(SparseMatrix<double, RowMajor> &A,
                  const Matrix<double, Dynamic, 1> &b, long maxIterations,
                  double tolerance = tolerance_) const {
    SparseMatrix<double, ColMajor> AColMajor(A.rows(), A.cols());

    // Copy row major to column major sparse matrix
    AColMajor.reserve(A.nonZeros());
    for (long k = 0; k < A.outerSize(); ++k)
      for (SparseMatrix<double, RowMajor>::InnerIterator it(A, k); it; ++it) {
        AColMajor.insert(it.row(), it.col()) = it.value();
      }

    return solve(A, AColMajor, b, maxIterations, tolerance);
  }